

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_ebgodunov_plm_fpu.cpp
# Opt level: O0

void EBPLM::PredictStateOnZFace
               (Box *zebox,int ncomp,Array4<double> *Imz,Array4<double> *Ipz,Array4<const_double> *q
               ,Array4<const_double> *wmac,Array4<const_amrex::EBCellFlag> *flag,
               Array4<const_double> *vfrac,Array4<const_double> *fcx,Array4<const_double> *fcy,
               Array4<const_double> *fcz,Array4<const_double> *ccc,Geometry *geom,Real dt,
               Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *h_bcrec,BCRec *pbc,
               bool is_velocity)

{
  int iVar1;
  int iVar2;
  void *in_RCX;
  void *in_RDX;
  Box *in_RDI;
  void *in_R8;
  void *in_R9;
  double in_XMM0_Qa;
  void *in_stack_00000008;
  void *in_stack_00000010;
  void *in_stack_00000018;
  void *in_stack_00000020;
  void *in_stack_00000028;
  void *in_stack_00000030;
  Geometry *in_stack_00000038;
  byte in_stack_00000050;
  bool has_extdir_or_ho_hi_z;
  bool has_extdir_or_ho_lo_z;
  bool has_extdir_or_ho_hi_y;
  bool has_extdir_or_ho_lo_y;
  bool has_extdir_or_ho_hi_x;
  bool has_extdir_or_ho_lo_x;
  pair<bool,_bool> extdir_lohi_z;
  pair<bool,_bool> extdir_lohi_y;
  pair<bool,_bool> extdir_lohi_x;
  int domain_khi;
  int domain_klo;
  int domain_jhi;
  int domain_jlo;
  int domain_ihi;
  int domain_ilo;
  Box *domain_box;
  Real dtdz;
  Real dz;
  int in_stack_fffffffffffff9e8;
  int in_stack_fffffffffffff9ec;
  BCRec *in_stack_fffffffffffff9f0;
  undefined1 local_5e8 [8];
  anon_class_696_20_3436472d *in_stack_fffffffffffffa20;
  int in_stack_fffffffffffffa2c;
  Box *in_stack_fffffffffffffa30;
  undefined1 auStack_5a8 [64];
  int local_568;
  int local_564;
  int local_560;
  int local_55c;
  int local_558;
  int local_554;
  undefined1 auStack_550 [64];
  undefined1 auStack_510 [64];
  double local_4d0;
  double local_4c8;
  undefined1 auStack_4b8 [64];
  undefined1 auStack_478 [64];
  undefined1 auStack_438 [64];
  undefined1 auStack_3f8 [64];
  undefined1 auStack_3b8 [64];
  undefined1 auStack_378 [64];
  byte local_338;
  undefined1 local_330 [64];
  undefined1 auStack_2f0 [64];
  int local_2b0;
  int local_2ac;
  int local_2a8;
  int local_2a4;
  int local_2a0;
  int local_29c;
  undefined1 auStack_298 [64];
  undefined1 auStack_258 [64];
  double local_218;
  undefined1 auStack_208 [64];
  undefined1 auStack_1c8 [64];
  undefined1 auStack_188 [64];
  undefined1 auStack_148 [64];
  undefined1 auStack_108 [64];
  undefined1 auStack_c8 [64];
  byte local_88;
  byte local_7c;
  byte local_7b;
  byte local_7a;
  byte local_79;
  byte local_78;
  byte local_77;
  pair<bool,_bool> local_76;
  pair<bool,_bool> local_74;
  pair<bool,_bool> local_72;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  Box *local_58;
  double local_50;
  Real local_48;
  byte local_39;
  double local_38;
  void *local_30;
  void *local_28;
  void *local_20;
  void *local_18;
  Box *local_8;
  
  local_39 = in_stack_00000050 & 1;
  local_38 = in_XMM0_Qa;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_8 = in_RDI;
  local_48 = amrex::CoordSys::CellSize(&in_stack_00000038->super_CoordSys,1);
  local_50 = local_38 / local_48;
  local_58 = amrex::Geometry::Domain(in_stack_00000038);
  local_5c = amrex::Box::smallEnd(local_58,0);
  local_60 = amrex::Box::bigEnd(local_58,0);
  local_64 = amrex::Box::smallEnd(local_58,1);
  local_68 = amrex::Box::bigEnd(local_58,1);
  local_6c = amrex::Box::smallEnd(local_58,2);
  local_70 = amrex::Box::bigEnd(local_58,2);
  std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::data
            ((vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)0xc4f7bf);
  local_72 = anon_unknown.dwarf_69ce34::has_extdir_or_ho
                       (in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec,
                        in_stack_fffffffffffff9e8);
  std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::data
            ((vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)0xc4f7e5);
  local_74 = anon_unknown.dwarf_69ce34::has_extdir_or_ho
                       (in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec,
                        in_stack_fffffffffffff9e8);
  std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::data
            ((vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)0xc4f80e);
  local_76 = anon_unknown.dwarf_69ce34::has_extdir_or_ho
                       (in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec,
                        in_stack_fffffffffffff9e8);
  iVar1 = local_5c;
  local_77 = local_72.first & 1;
  local_78 = local_72.second & 1;
  local_79 = local_74.first & 1;
  local_7a = local_74.second & 1;
  local_7b = local_76.first & 1;
  local_7c = local_76.second & 1;
  if (((ushort)local_72 & 1) == 0) {
LAB_00c4f8bf:
    iVar1 = local_60;
    if ((local_78 & 1) != 0) {
      iVar2 = amrex::Box::bigEnd(local_8,0);
      if (iVar1 <= iVar2) goto LAB_00c4f9c7;
    }
    iVar1 = local_6c;
    if ((local_7b & 1) != 0) {
      iVar2 = amrex::Box::smallEnd(local_8,2);
      if (iVar2 + -1 <= iVar1) goto LAB_00c4f9c7;
    }
    iVar1 = local_70;
    if ((local_7c & 1) != 0) {
      iVar2 = amrex::Box::bigEnd(local_8,2);
      if (iVar1 <= iVar2) goto LAB_00c4f9c7;
    }
    iVar1 = local_64;
    if ((local_79 & 1) != 0) {
      iVar2 = amrex::Box::smallEnd(local_8,1);
      if (iVar2 + -1 <= iVar1) goto LAB_00c4f9c7;
    }
    iVar1 = local_68;
    if ((local_7a & 1) != 0) {
      iVar2 = amrex::Box::bigEnd(local_8,1);
      if (iVar1 <= iVar2) goto LAB_00c4f9c7;
    }
    memcpy(local_5e8,local_28,0x3c);
    memcpy(auStack_5a8,local_30,0x3c);
    local_568 = local_5c;
    local_564 = local_64;
    local_560 = local_6c;
    local_55c = local_60;
    local_558 = local_68;
    local_554 = local_70;
    memcpy(auStack_550,local_18,0x3c);
    memcpy(auStack_510,local_20,0x3c);
    local_4d0 = local_38;
    local_4c8 = local_50;
    memcpy(auStack_4b8,in_stack_00000008,0x3c);
    memcpy(auStack_478,in_stack_00000010,0x3c);
    memcpy(auStack_438,in_stack_00000030,0x3c);
    memcpy(auStack_3f8,in_stack_00000018,0x3c);
    memcpy(auStack_3b8,in_stack_00000020,0x3c);
    memcpy(auStack_378,in_stack_00000028,0x3c);
    local_338 = local_39 & 1;
    amrex::
    ParallelFor<int,EBPLM::PredictStateOnZFace(amrex::Box_const&,int,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<amrex::EBCellFlag_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Geometry_const&,double,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,amrex::BCRec_const*,bool)::__1,void>
              (in_stack_fffffffffffffa30,in_stack_fffffffffffffa2c,in_stack_fffffffffffffa20);
  }
  else {
    iVar2 = amrex::Box::smallEnd(local_8,0);
    if (iVar1 < iVar2 + -1) goto LAB_00c4f8bf;
LAB_00c4f9c7:
    memcpy(local_330,local_28,0x3c);
    memcpy(auStack_2f0,local_30,0x3c);
    local_2b0 = local_5c;
    local_2ac = local_64;
    local_2a8 = local_6c;
    local_2a4 = local_60;
    local_2a0 = local_68;
    local_29c = local_70;
    memcpy(auStack_298,local_18,0x3c);
    memcpy(auStack_258,local_20,0x3c);
    local_218 = local_50;
    memcpy(auStack_208,in_stack_00000008,0x3c);
    memcpy(auStack_1c8,in_stack_00000010,0x3c);
    memcpy(auStack_188,in_stack_00000030,0x3c);
    memcpy(auStack_148,in_stack_00000018,0x3c);
    memcpy(auStack_108,in_stack_00000020,0x3c);
    memcpy(auStack_c8,in_stack_00000028,0x3c);
    local_88 = local_39 & 1;
    amrex::
    ParallelFor<int,EBPLM::PredictStateOnZFace(amrex::Box_const&,int,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<amrex::EBCellFlag_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Geometry_const&,double,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,amrex::BCRec_const*,bool)::__0,void>
              (in_stack_fffffffffffffa30,in_stack_fffffffffffffa2c,
               (anon_class_688_19_da5fa63c *)in_stack_fffffffffffffa20);
  }
  return;
}

Assistant:

void
EBPLM::PredictStateOnZFace ( Box const& zebox, int ncomp,
                             Array4<Real> const& Imz, Array4<Real> const& Ipz,
                             Array4<Real const> const& q,
                             Array4<Real const> const& wmac,
                             Array4<EBCellFlag const> const& flag,
                             Array4<Real const> const& vfrac,
                             AMREX_D_DECL(Array4<Real const> const& fcx,
                                          Array4<Real const> const& fcy,
                                          Array4<Real const> const& fcz),
                             Array4<Real const> const& ccc,
                             Geometry const& geom,
                             Real dt,
                             Vector<BCRec> const& h_bcrec,
                             BCRec const* pbc, bool is_velocity)
{
    const Real dz = geom.CellSize(1);
    const Real dtdz = dt/dz;

    const Box& domain_box = geom.Domain();
    const int domain_ilo = domain_box.smallEnd(0);
    const int domain_ihi = domain_box.bigEnd(0);
    const int domain_jlo = domain_box.smallEnd(1);
    const int domain_jhi = domain_box.bigEnd(1);
    const int domain_klo = domain_box.smallEnd(2);
    const int domain_khi = domain_box.bigEnd(2);

    // At an ext_dir boundary, the boundary value is on the face, not cell center.
    auto extdir_lohi_x = has_extdir_or_ho(h_bcrec.data(), ncomp, static_cast<int>(Direction::x));
    auto extdir_lohi_y = has_extdir_or_ho(h_bcrec.data(), ncomp, static_cast<int>(Direction::y));
    auto extdir_lohi_z = has_extdir_or_ho(h_bcrec.data(), ncomp, static_cast<int>(Direction::z));

    bool has_extdir_or_ho_lo_x = extdir_lohi_x.first;
    bool has_extdir_or_ho_hi_x = extdir_lohi_x.second;
    bool has_extdir_or_ho_lo_y = extdir_lohi_y.first;
    bool has_extdir_or_ho_hi_y = extdir_lohi_y.second;
    bool has_extdir_or_ho_lo_z = extdir_lohi_z.first;
    bool has_extdir_or_ho_hi_z = extdir_lohi_z.second;

    if ( (has_extdir_or_ho_lo_x && domain_ilo >= zebox.smallEnd(0)-1) ||
         (has_extdir_or_ho_hi_x && domain_ihi <= zebox.bigEnd(0)    ) ||
         (has_extdir_or_ho_lo_z && domain_klo >= zebox.smallEnd(2)-1) ||
         (has_extdir_or_ho_hi_z && domain_khi <= zebox.bigEnd(2)    ) ||
         (has_extdir_or_ho_lo_y && domain_jlo >= zebox.smallEnd(1)-1) ||
         (has_extdir_or_ho_hi_y && domain_jhi <= zebox.bigEnd(1)    )  )
    {
        amrex::ParallelFor(zebox, ncomp, [q,wmac,AMREX_D_DECL(domain_ilo,domain_jlo,domain_klo),
                                                 AMREX_D_DECL(domain_ihi,domain_jhi,domain_khi),
                                          Imz,Ipz,dtdz,pbc,flag,vfrac,ccc,AMREX_D_DECL(fcx,fcy,fcz),
                                          is_velocity]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            Real qpls(0.);
            Real qmns(0.);

            // This means apz(i,j,k) > 0 and we have un-covered cells on both sides
            if (flag(i,j,k).isConnected(0,0,-1))
            {
                const auto& bc = pbc[n];
                bool extdir_or_ho_ilo = (bc.lo(0) == BCType::ext_dir) ||
                                        (bc.lo(0) == BCType::hoextrap);
                bool extdir_or_ho_ihi = (bc.hi(0) == BCType::ext_dir) ||
                                        (bc.hi(0) == BCType::hoextrap);
                bool extdir_or_ho_jlo = (bc.lo(1) == BCType::ext_dir) ||
                                        (bc.lo(1) == BCType::hoextrap);
                bool extdir_or_ho_jhi = (bc.hi(1) == BCType::ext_dir) ||
                                        (bc.hi(1) == BCType::hoextrap);
                bool extdir_or_ho_klo = (bc.lo(2) == BCType::ext_dir) ||
                                        (bc.lo(2) == BCType::hoextrap);
                bool extdir_or_ho_khi = (bc.hi(2) == BCType::ext_dir) ||
                                        (bc.hi(2) == BCType::hoextrap);

                // *************************************************
                // Making qpls
                // *************************************************

                // We have enough cells to do 4th order slopes centered on (i,j,k) with all values at cell centers
                if (vfrac(i,j,k) == 1. && vfrac(i,j,k-1) == 1. && vfrac(i,j,k-2) == 1. &&
                                          vfrac(i,j,k+1) == 1. && vfrac(i,j,k+2) == 1.)
                {
                    int order = 4;
                    qpls = q(i,j,k,n) + 0.5 * (-1.0 - wmac(i,j,k) * dtdz) *
                        amrex_calc_zslope_extdir(i,j,k,n,order,q,extdir_or_ho_klo,extdir_or_ho_khi,domain_klo,domain_khi);

                // We have enough cells to do 2nd order slopes with all values at cell centers
                } else if (vfrac(i,j,k) == 1. && vfrac(i,j,k-1) == 1. && vfrac(i,j,k+1) == 1.) {

                    int order = 2;
                    qpls = q(i,j,k,n) + 0.5 * (-1.0 - wmac(i,j,k) * dtdz) *
                        amrex_calc_zslope_extdir(i,j,k,n,order,q,extdir_or_ho_klo,extdir_or_ho_khi,domain_klo,domain_khi);

                // We need to use LS slopes
                } else {

                   Real xf = fcz(i,j,k,0); // local (x,y) of centroid of z-face we are extrapolating to
                   Real yf = fcz(i,j,k,1);

                   AMREX_D_TERM(Real delta_z = 0.5 + ccc(i,j,k,2);,
                                Real delta_x = xf  - ccc(i,j,k,0);,
                                Real delta_y = yf  - ccc(i,j,k,1););

                   Real qcc_max = amrex::max(q(i,j,k,n), q(i,j,k-1,n));
                   Real qcc_min = amrex::min(q(i,j,k,n), q(i,j,k-1,n));

                   // This will be used in the EB slope routine only if the slope can be computed without LS
                   int max_order = 2;

                   const auto& slopes_eb_hi = amrex_lim_slopes_extdir_eb(i,j,k,n,q,ccc,vfrac,
                                              AMREX_D_DECL(fcx,fcy,fcz), flag,
                                              AMREX_D_DECL(extdir_or_ho_ilo, extdir_or_ho_jlo, extdir_or_ho_klo),
                                              AMREX_D_DECL(extdir_or_ho_ihi, extdir_or_ho_jhi, extdir_or_ho_khi),
                                              AMREX_D_DECL(domain_ilo, domain_jlo, domain_klo),
                                              AMREX_D_DECL(domain_ihi, domain_jhi, domain_khi),
                                              max_order);

                   qpls = q(i,j,k,n) - delta_z * slopes_eb_hi[2]
                                     + delta_x * slopes_eb_hi[0]
                                     + delta_y * slopes_eb_hi[1];

                   qpls = amrex::max(amrex::min(qpls, qcc_max), qcc_min);
                   qpls -= 0.5 * dtdz * wmac(i,j,k) * slopes_eb_hi[2];

                }  // end of making qpls

                // Only over-write normal velocity with Dirichlet bc at lo face
                if (k == domain_klo && (bc.lo(2) == BCType::ext_dir))
                    if (is_velocity && n == 2) qpls = q(i,j,k-1,n);

                // Over-write all with Dirichlet bc at hi face
                if (k == domain_khi+1 && (bc.hi(2) == BCType::ext_dir))
                    qpls = q(i,j,k,n);

                // *************************************************
                // Making qmns
                // *************************************************

                // We have enough cells to do 4th order slopes centered on (i,j,k-1) with all values at cell centers
                if (vfrac(i,j,k-1) == 1. && vfrac(i,j,k-2) == 1. && vfrac(i,j,k-3) == 1. &&
                                            vfrac(i,j,k  ) == 1. && vfrac(i,j,k+1) == 1.)
                {
                    int order = 4;
                    qmns = q(i,j,k-1,n) + 0.5 * ( 1.0 - wmac(i,j,k) * dtdz) *
                        amrex_calc_zslope_extdir(i,j,k-1,n,order,q,extdir_or_ho_klo,extdir_or_ho_khi,domain_klo,domain_khi);

                // We have enough cells to do 2nd order slopes with all values at cell centers
                } else if (vfrac(i,j,k-1) == 1. && vfrac(i,j,k-2) == 1. && vfrac(i,j,k  ) == 1.)
                {
                    int order = 2;
                    qmns = q(i,j,k-1,n) + 0.5 * ( 1.0 - wmac(i,j,k) * dtdz) *
                        amrex_calc_zslope_extdir(i,j,k-1,n,order,q,extdir_or_ho_klo,extdir_or_ho_khi,domain_klo,domain_khi);

                // We need to use LS slopes
                } else {

                   Real xf = fcz(i,j,k,0); // local (x,y) of centroid of z-face we are extrapolating to
                   Real yf = fcz(i,j,k,1);

                   AMREX_D_TERM(Real delta_z = 0.5 - ccc(i,j,k-1,2);,
                                Real delta_x = xf  - ccc(i,j,k-1,0);,
                                Real delta_y = yf  - ccc(i,j,k-1,1););

                   Real qcc_max = amrex::max(q(i,j,k,n), q(i,j,k-1,n));
                   Real qcc_min = amrex::min(q(i,j,k,n), q(i,j,k-1,n));

                   // This will be used in the EB slope routine only if the slope can be computed without LS
                   int max_order = 2;

                   const auto& slopes_eb_lo = amrex_lim_slopes_extdir_eb(i,j,k-1,n,q,ccc,vfrac,
                                              AMREX_D_DECL(fcx,fcy,fcz), flag,
                                              AMREX_D_DECL(extdir_or_ho_ilo, extdir_or_ho_jlo, extdir_or_ho_klo),
                                              AMREX_D_DECL(extdir_or_ho_ihi, extdir_or_ho_jhi, extdir_or_ho_khi),
                                              AMREX_D_DECL(domain_ilo, domain_jlo, domain_klo),
                                              AMREX_D_DECL(domain_ihi, domain_jhi, domain_khi),
                                              max_order);


                   qmns = q(i,j,k-1,n) + delta_x * slopes_eb_lo[0]
                                       + delta_y * slopes_eb_lo[1]
                                       + delta_z * slopes_eb_lo[2];

                   qmns = amrex::max(amrex::min(qmns, qcc_max), qcc_min);
                   qmns -= 0.5 * dtdz * wmac(i,j,k) * slopes_eb_lo[2];

                }  // end of making qmns

                // Over-write all with Dirichlet bc at lo face
                if (k == domain_klo && (bc.lo(2) == BCType::ext_dir))
                    qmns = q(i,j,k-1,n);

                // Only over-write normal velocity with Dirichlet bc at hi face
                if (k == domain_khi+1 && (bc.hi(2) == BCType::ext_dir))
                    if (is_velocity && n == 2) qmns = q(i,j,k,n);
            }

            Ipz(i,j,k-1,n) = qmns;
            Imz(i,j,k  ,n) = qpls;
        });
    }
    else // The cases below are not near any domain boundary
    {
        amrex::ParallelFor(zebox, ncomp, [q,wmac,AMREX_D_DECL(domain_ilo,domain_jlo,domain_klo),
                                                 AMREX_D_DECL(domain_ihi,domain_jhi,domain_khi),
                                          Imz,Ipz,dt,dtdz,pbc,flag,vfrac,ccc,AMREX_D_DECL(fcx,fcy,fcz),
                                          is_velocity]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            Real qpls(0.);
            Real qmns(0.);

            // This means apz(i,j,k) > 0 and we have un-covered cells on both sides
            if (flag(i,j,k).isConnected(0,0,-1))
            {
                // *************************************************
                // Making qpls
                // *************************************************

                // We have enough cells to do 4th order slopes centered on (i,j,k) with all values at cell centers
                if (vfrac(i,j,k) == 1. && vfrac(i,j,k-1) == 1. && vfrac(i,j,k-2) == 1. &&
                                          vfrac(i,j,k+1) == 1. && vfrac(i,j,k+2) == 1.)
                {
                    int order = 4;
                    qpls = q(i,j,k,n) + 0.5 * (-1.0 - wmac(i,j,k) * dtdz) *
                        amrex_calc_zslope(i,j,k,n,order,q);

                // We have enough cells to do 2nd order slopes with all values at cell centers
                } else if (vfrac(i,j,k) == 1. && vfrac(i,j,k-1) == 1. && vfrac(i,j,k+1) == 1.) {

                    int order = 2;
                    qpls = q(i,j,k,n) + 0.5 * (-1.0 - wmac(i,j,k) * dtdz) *
                        amrex_calc_zslope(i,j,k,n,order,q);

                // We need to use LS slopes
                } else {

                   Real xf = fcz(i,j,k,0); // local (x,y) of centroid of z-face we are extrapolating to
                   Real yf = fcz(i,j,k,1);

                   AMREX_D_TERM(Real delta_z = 0.5 + ccc(i,j,k,2);,
                                Real delta_x = xf  - ccc(i,j,k,0);,
                                Real delta_y = yf  - ccc(i,j,k,1););

                   Real qcc_max = amrex::max(q(i,j,k,n), q(i,j,k-1,n));
                   Real qcc_min = amrex::min(q(i,j,k,n), q(i,j,k-1,n));

                   // This will be used in the EB slope routine only if the slope can be computed without LS
                   int max_order = 2;

                   const auto& slopes_eb_hi = amrex_lim_slopes_eb(i,j,k,n,q,ccc,vfrac,
                                                                  AMREX_D_DECL(fcx,fcy,fcz),flag,max_order);

                   qpls = q(i,j,k,n) - delta_z * slopes_eb_hi[2]
                                     + delta_x * slopes_eb_hi[0]
                                     + delta_y * slopes_eb_hi[1];

                   qpls = amrex::max(amrex::min(qpls, qcc_max), qcc_min);
                   qpls -= 0.5 * dtdz * wmac(i,j,k) * slopes_eb_hi[2];

                }  // end of making qpls

                // *************************************************
                // Making qmns
                // *************************************************

                // We have enough cells to do 4th order slopes centered on (i,j,k-1) with all values at cell centers
                if (vfrac(i,j,k-1) == 1. && vfrac(i,j,k-2) == 1. && vfrac(i,j,k-3) == 1. &&
                                            vfrac(i,j,k  ) == 1. && vfrac(i,j,k+1) == 1.)
                {
                    int order = 4;
                    qmns = q(i,j,k-1,n) + 0.5 * ( 1.0 - wmac(i,j,k) * dtdz) *
                        amrex_calc_zslope(i,j,k-1,n,order,q);

                // We have enough cells to do 2nd order slopes with all values at cell centers
                } else if (vfrac(i,j,k-1) == 1. && vfrac(i,j,k-2) == 1. && vfrac(i,j,k  ) == 1.)
                {
                    int order = 2;
                    qmns = q(i,j,k-1,n) + 0.5 * ( 1.0 - wmac(i,j,k) * dtdz) *
                        amrex_calc_zslope(i,j,k-1,n,order,q);

                // We need to use LS slopes
                } else {

                   Real xf = fcz(i,j,k,0); // local (x,y) of centroid of z-face we are extrapolating to
                   Real yf = fcz(i,j,k,1);

                   AMREX_D_TERM(Real delta_z = 0.5 - ccc(i,j,k-1,2);,
                                Real delta_x = xf  - ccc(i,j,k-1,0);,
                                Real delta_y = yf  - ccc(i,j,k-1,1););

                   Real qcc_max = amrex::max(q(i,j,k,n), q(i,j,k-1,n));
                   Real qcc_min = amrex::min(q(i,j,k,n), q(i,j,k-1,n));

                   // This will be used in the EB slope routine only if the slope can be computed without LS
                   int max_order = 2;

                   const auto& slopes_eb_lo = amrex_lim_slopes_eb(i,j,k-1,n,q,ccc,vfrac,
                                                                  AMREX_D_DECL(fcx,fcy,fcz),flag,max_order);

                   qmns = q(i,j,k-1,n) + delta_x * slopes_eb_lo[0]
                                       + delta_y * slopes_eb_lo[1]
                                       + delta_z * slopes_eb_lo[2];

                   qmns = amrex::max(amrex::min(qmns, qcc_max), qcc_min);
                   qmns -= 0.5 * dtdz * wmac(i,j,k) * slopes_eb_lo[2];

                }  // end of making qmns
            }

            Ipz(i,j,k-1,n) = qmns;
            Imz(i,j,k  ,n) = qpls;
        });
    }
}